

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSearchPath.cpp
# Opt level: O3

string * __thiscall
MinVR::VRSearchPath::getFullFilenames
          (string *__return_storage_ptr__,VRSearchPath *this,string *desiredFile)

{
  long *plVar1;
  long *plVar2;
  _List_node_base *p_Var3;
  string out;
  long *local_98;
  long local_88;
  long lStack_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  string *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  p_Var3 = (this->_searchPath).
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)&this->_searchPath) {
    local_58 = __return_storage_ptr__;
    do {
      (**this->_vptr_VRSearchPath)(local_50,this,desiredFile,p_Var3 + 1);
      plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_88 = *plVar2;
        lStack_80 = plVar1[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar2;
        local_98 = (long *)*plVar1;
      }
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98);
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      p_Var3 = p_Var3->_M_next;
      __return_storage_ptr__ = local_58;
    } while (p_Var3 != (_List_node_base *)&this->_searchPath);
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VRSearchPath::getFullFilenames(const std::string &desiredFile) const {

    std::string out;
    for (std::list<std::string>::const_iterator it = _searchPath.begin();
         it != _searchPath.end(); it++)
        out += _selectFile(desiredFile, (*it)) + ":";

    return out.substr(0, out.length() - 1);
}